

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

void __thiscall
QMainWindow::resizeDocks
          (QMainWindow *this,QList<QDockWidget_*> *docks,QList<int> *sizes,Orientation orientation)

{
  QDockAreaLayout::resizeDocks
            ((QDockAreaLayout *)
             (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x260) + 0x1a0),docks,sizes,
             orientation);
  (**(code **)(**(long **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260) + 0x70))();
  return;
}

Assistant:

void QMainWindow::resizeDocks(const QList<QDockWidget *> &docks,
                              const QList<int> &sizes, Qt::Orientation orientation)
{
    d_func()->layout->layoutState.dockAreaLayout.resizeDocks(docks, sizes, orientation);
    d_func()->layout->invalidate();
}